

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QDBusListener::ChangeSignal>::moveAppend
          (QGenericArrayOps<QDBusListener::ChangeSignal> *this,ChangeSignal *b,ChangeSignal *e)

{
  ChangeSignal *pCVar1;
  ChangeSignal *in_RDX;
  ChangeSignal *in_RSI;
  long in_RDI;
  ChangeSignal *data;
  ChangeSignal *local_10;
  
  if (in_RSI != in_RDX) {
    pCVar1 = QArrayDataPointer<QDBusListener::ChangeSignal>::begin
                       ((QArrayDataPointer<QDBusListener::ChangeSignal> *)0xb29807);
    local_10 = in_RSI;
    while (local_10 < in_RDX) {
      pCVar1[*(long *)(in_RDI + 0x10)] = *local_10;
      local_10 = local_10 + 1;
      *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 1;
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }